

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

bool __thiscall ON_Brep::MatchTrimEnds(ON_Brep *this,ON_BrepLoop *Loop)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  ON_BrepTrim *pOVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar2 = (Loop->m_ti).m_count;
  uVar9 = 0;
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  bVar7 = true;
  while (uVar8 != uVar9) {
    piVar4 = (Loop->m_ti).m_a;
    piVar1 = piVar4 + uVar9;
    pOVar5 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    uVar9 = uVar9 + 1;
    bVar6 = MatchTrimEnds(this,pOVar5 + *piVar1,
                          pOVar5 + piVar4[(long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 |
                                                uVar9 & 0xffffffff) % (long)(int)uVar2 & 0xffffffff]
                         );
    bVar7 = (bool)(bVar7 & bVar6);
  }
  ON_BoundingBox::Destroy(&Loop->m_pbox);
  for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    iVar3 = (Loop->m_ti).m_a[uVar9];
    pOVar5 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    pOVar5[iVar3].m_pbox.m_min.z = 0.0;
    pOVar5[iVar3].m_pbox.m_max.z = 0.0;
    ON_BoundingBox::Union(&Loop->m_pbox,&pOVar5[iVar3].m_pbox);
  }
  return bVar7;
}

Assistant:

bool ON_Brep::MatchTrimEnds(ON_BrepLoop& Loop)

{
  int i;
  bool rc = true;
  int count = Loop.m_ti.Count();
  for (i=0; i<count; i++){
    if (!MatchTrimEnds(m_T[Loop.m_ti[i]], m_T[Loop.m_ti[(i+1)%count]]))
    {
      rc = false;
    }
  }

  // 11 Nov 2002 Dale Lear: I added this pbox setting stuff
  Loop.m_pbox.Destroy();
  for (i=0; i<count; i++)
  {
    ON_BrepTrim& trim = m_T[Loop.m_ti[i]];
    trim.m_pbox.m_min.z = 0.0;
    trim.m_pbox.m_max.z = 0.0;
    Loop.m_pbox.Union( trim.m_pbox );
  }

  return rc;
}